

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O3

void __thiscall
Js::RecyclableObject::RecyclableObject
          (RecyclableObject *this,DynamicType *type,ScriptContext *scriptContext)

{
  Type *addr;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  
  (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_0153cba0;
  addr = &this->type;
  Memory::Recycler::WBSetBit((char *)addr);
  (this->type).ptr = &type->super_Type;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  if ((type->super_Type).typeId != TypeIds_GlobalObject) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                ,0x7b,"(type->GetTypeId() == TypeIds_GlobalObject)",
                                "type->GetTypeId() == TypeIds_GlobalObject");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  uVar4 = (ulong)addr->ptr->typeId;
  if (uVar4 < 0x58) {
    scriptContext->instanceCount[uVar4] = scriptContext->instanceCount[uVar4] + 1;
  }
  return;
}

Assistant:

RecyclableObject::RecyclableObject(DynamicType * type, ScriptContext * scriptContext) : type(type)
    {
#if DBG_EXTRAFIELD
        dtorCalled = false;
#ifdef HEAP_ENUMERATION_VALIDATION
        m_heapEnumValidationCookie = 0;
#endif
#endif
        Assert(type->GetTypeId() == TypeIds_GlobalObject);
        RecordAllocation(scriptContext);
    }